

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_array_vector.cpp
# Opt level: O2

void vectorCreation(void)

{
  VectorXf V;
  VectorXf objv;
  int local_2c;
  Matrix<float,__1,_1,_0,__1,_1> local_28;
  Matrix<float,__1,_1,_0,__1,_1> local_18;
  
  local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ = 10
  ;
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_18,(int *)&local_28);
  local_2c = 0x1e;
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_28,&local_2c);
  free((void *)CONCAT44(local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data._4_4_,
                        local_28.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data._0_4_));
  free(local_18.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void vectorCreation() {
  // Vector3f is a fixed column vector of 3 floats:
  Eigen::Vector3f objVector3f;

  // RowVector2i is a fixed row vector of 3 integer:
  Eigen::RowVector2i objRowVector2i;

  // VectorXf is a column vector of size 10 floats:
  Eigen::VectorXf objv(10);

  // V is a dynamic-size vector of size 30, with allocated but currently
  // uninitialized coefficients.
  Eigen::VectorXf V(30);
}